

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-fs-poll.c
# Opt level: O0

void poll_cb(uv_poll_t *handle,int status,int events)

{
  int iVar1;
  int iVar2;
  ssize_t sVar3;
  int *piVar4;
  bool bVar5;
  int local_28;
  int fd;
  int n;
  int iStack_18;
  char buffer [5];
  int events_local;
  int status_local;
  uv_poll_t *handle_local;
  
  iStack_18 = events;
  buffer._1_4_ = status;
  iVar1 = uv_fileno(handle);
  if (iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/neovim[P]libuv/test/test-poll-oob.c"
            ,0x49,"0 == uv_fileno((uv_handle_t*)handle, &fd)");
    abort();
  }
  memset((void *)((long)&fd + 3),0,5);
  if ((iStack_18 & 8U) != 0) {
    do {
      sVar3 = recv(client_fd,(void *)((long)&fd + 3),5,1);
      bVar5 = false;
      if ((int)sVar3 == -1) {
        piVar4 = __errno_location();
        bVar5 = *piVar4 == 4;
      }
    } while (bVar5);
    if (((int)sVar3 < 0) && (piVar4 = __errno_location(), *piVar4 == 0x16)) {
      fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
              "/workspace/llm4binary/github/license_all_cmakelists_25/neovim[P]libuv/test/test-poll-oob.c"
              ,0x50,"n >= 0 || errno != EINVAL");
      abort();
    }
    cli_pr_check = 1;
    iVar1 = uv_poll_stop(poll_req);
    if (iVar1 != 0) {
      fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
              "/workspace/llm4binary/github/license_all_cmakelists_25/neovim[P]libuv/test/test-poll-oob.c"
              ,0x52,"0 == uv_poll_stop(&poll_req[0])");
      abort();
    }
    iVar1 = uv_poll_start(poll_req,3,poll_cb);
    if (iVar1 != 0) {
      fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
              "/workspace/llm4binary/github/license_all_cmakelists_25/neovim[P]libuv/test/test-poll-oob.c"
              ,0x55,"0 == uv_poll_start(&poll_req[0], UV_READABLE | UV_WRITABLE, poll_cb)");
      abort();
    }
  }
  if ((iStack_18 & 1U) != 0) {
    if (local_28 == client_fd) {
      do {
        sVar3 = recv(client_fd,(void *)((long)&fd + 3),5,0);
        iVar1 = (int)sVar3;
        bVar5 = false;
        if (iVar1 == -1) {
          piVar4 = __errno_location();
          bVar5 = *piVar4 == 4;
        }
      } while (bVar5);
      if ((iVar1 < 0) && (piVar4 = __errno_location(), *piVar4 == 0x16)) {
        fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
                "/workspace/llm4binary/github/license_all_cmakelists_25/neovim[P]libuv/test/test-poll-oob.c"
                ,0x5c,"n >= 0 || errno != EINVAL");
        abort();
      }
      if (cli_rd_check == 1) {
        iVar2 = strncmp((char *)((long)&fd + 3),"world",(long)iVar1);
        if (iVar2 != 0) {
          fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/neovim[P]libuv/test/test-poll-oob.c"
                  ,0x5e,"strncmp(buffer, \"world\", n) == 0");
          abort();
        }
        if (iVar1 != 5) {
          fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/neovim[P]libuv/test/test-poll-oob.c"
                  ,0x5f,"5 == n");
          abort();
        }
        cli_rd_check = 2;
      }
      if (cli_rd_check == 0) {
        if (iVar1 != 4) {
          fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/neovim[P]libuv/test/test-poll-oob.c"
                  ,99,"n == 4");
          abort();
        }
        iVar1 = strncmp((char *)((long)&fd + 3),"hello",4);
        if (iVar1 != 0) {
          fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/neovim[P]libuv/test/test-poll-oob.c"
                  ,100,"strncmp(buffer, \"hello\", n) == 0");
          abort();
        }
        cli_rd_check = 1;
        do {
          do {
            sVar3 = recv(server_fd,(void *)((long)&fd + 3),5,0);
            iVar1 = (int)sVar3;
            bVar5 = false;
            if (iVar1 == -1) {
              piVar4 = __errno_location();
              bVar5 = *piVar4 == 4;
            }
          } while (bVar5);
          if (0 < iVar1) {
            if (iVar1 != 5) {
              fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/neovim[P]libuv/test/test-poll-oob.c"
                      ,0x6b,"n == 5");
              abort();
            }
            iVar2 = strncmp((char *)((long)&fd + 3),"world",5);
            if (iVar2 != 0) {
              fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/neovim[P]libuv/test/test-poll-oob.c"
                      ,0x6c,"strncmp(buffer, \"world\", n) == 0");
              abort();
            }
            cli_rd_check = 2;
          }
        } while (0 < iVar1);
        iVar1 = got_eagain();
        if (iVar1 == 0) {
          fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/neovim[P]libuv/test/test-poll-oob.c"
                  ,0x71,"got_eagain()");
          abort();
        }
      }
    }
    if (local_28 == server_fd) {
      do {
        sVar3 = recv(server_fd,(void *)((long)&fd + 3),3,0);
        iVar1 = (int)sVar3;
        bVar5 = false;
        if (iVar1 == -1) {
          piVar4 = __errno_location();
          bVar5 = *piVar4 == 4;
        }
      } while (bVar5);
      if ((iVar1 < 0) && (piVar4 = __errno_location(), *piVar4 == 0x16)) {
        fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
                "/workspace/llm4binary/github/license_all_cmakelists_25/neovim[P]libuv/test/test-poll-oob.c"
                ,0x78,"n >= 0 || errno != EINVAL");
        abort();
      }
      if (iVar1 != 3) {
        fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
                "/workspace/llm4binary/github/license_all_cmakelists_25/neovim[P]libuv/test/test-poll-oob.c"
                ,0x79,"3 == n");
        abort();
      }
      iVar1 = strncmp((char *)((long)&fd + 3),"foo",3);
      if (iVar1 != 0) {
        fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
                "/workspace/llm4binary/github/license_all_cmakelists_25/neovim[P]libuv/test/test-poll-oob.c"
                ,0x7a,"strncmp(buffer, \"foo\", n) == 0");
        abort();
      }
      srv_rd_check = 1;
      uv_poll_stop(0x30f570);
    }
  }
  if ((iStack_18 & 2U) != 0) {
    do {
      sVar3 = send(client_fd,"foo",3,0);
      bVar5 = false;
      if ((int)sVar3 < 0) {
        piVar4 = __errno_location();
        bVar5 = *piVar4 == 4;
      }
    } while (bVar5);
    if ((int)sVar3 != 3) {
      fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
              "/workspace/llm4binary/github/license_all_cmakelists_25/neovim[P]libuv/test/test-poll-oob.c"
              ,0x83,"3 == n");
      abort();
    }
  }
  return;
}

Assistant:

static void poll_cb(uv_fs_poll_t* handle,
                    int status,
                    const uv_stat_t* prev,
                    const uv_stat_t* curr) {
  uv_stat_t zero_statbuf;

  memset(&zero_statbuf, 0, sizeof(zero_statbuf));

  ASSERT(handle == &poll_handle);
  ASSERT(1 == uv_is_active((uv_handle_t*) handle));
  ASSERT_NOT_NULL(prev);
  ASSERT_NOT_NULL(curr);

  switch (poll_cb_called++) {
  case 0:
    ASSERT(status == UV_ENOENT);
    ASSERT(0 == memcmp(prev, &zero_statbuf, sizeof(zero_statbuf)));
    ASSERT(0 == memcmp(curr, &zero_statbuf, sizeof(zero_statbuf)));
    touch_file(FIXTURE);
    break;

  case 1:
    ASSERT(status == 0);
    ASSERT(0 == memcmp(prev, &zero_statbuf, sizeof(zero_statbuf)));
    ASSERT(0 != memcmp(curr, &zero_statbuf, sizeof(zero_statbuf)));
    ASSERT(0 == uv_timer_start(&timer_handle, timer_cb, 20, 0));
    break;

  case 2:
    ASSERT(status == 0);
    ASSERT(0 != memcmp(prev, &zero_statbuf, sizeof(zero_statbuf)));
    ASSERT(0 != memcmp(curr, &zero_statbuf, sizeof(zero_statbuf)));
    ASSERT(0 == uv_timer_start(&timer_handle, timer_cb, 200, 0));
    break;

  case 3:
    ASSERT(status == 0);
    ASSERT(0 != memcmp(prev, &zero_statbuf, sizeof(zero_statbuf)));
    ASSERT(0 != memcmp(curr, &zero_statbuf, sizeof(zero_statbuf)));
    remove(FIXTURE);
    break;

  case 4:
    ASSERT(status == UV_ENOENT);
    ASSERT(0 != memcmp(prev, &zero_statbuf, sizeof(zero_statbuf)));
    ASSERT(0 == memcmp(curr, &zero_statbuf, sizeof(zero_statbuf)));
    uv_close((uv_handle_t*)handle, close_cb);
    break;

  default:
    ASSERT(0);
  }
}